

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O2

void __thiscall PresolveComponentData::clear(PresolveComponentData *this)

{
  HighsPostsolveStack local_f0;
  
  (this->super_HighsComponentData).is_valid = false;
  memset(&local_f0,0,0xd8);
  local_f0.origNumCol = -1;
  local_f0.origNumRow = -1;
  presolve::HighsPostsolveStack::operator=(&this->postSolveStack,&local_f0);
  presolve::HighsPostsolveStack::~HighsPostsolveStack(&local_f0);
  HighsLp::clear(&this->reduced_lp_);
  HighsSolution::clear(&this->recovered_solution_);
  HighsBasis::clear(&this->recovered_basis_);
  return;
}

Assistant:

void clear() {
    is_valid = false;

    postSolveStack = presolve::HighsPostsolveStack();

    reduced_lp_.clear();
    recovered_solution_.clear();
    recovered_basis_.clear();
  }